

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t cab_skip_sfx(archive_read *a)

{
  wchar_t wVar1;
  char *pcVar2;
  wchar_t next;
  char *h;
  ssize_t window;
  ssize_t bytes;
  size_t skip;
  char *q;
  char *p;
  archive_read *a_local;
  
  h = (char *)0x1000;
  p = (char *)a;
  do {
    while (pcVar2 = (char *)__archive_read_ahead((archive_read *)p,(size_t)h,&window),
          pcVar2 == (char *)0x0) {
      h = (char *)((long)h >> 1);
      if (h < (char *)0x80) {
        archive_set_error((archive *)p,0x54,"Couldn\'t find out CAB header");
        return L'\xffffffe2';
      }
    }
    skip = (size_t)(pcVar2 + window);
    for (q = pcVar2; q + 8 < skip; q = q + wVar1) {
      wVar1 = find_cab_magic(q);
      if (wVar1 == L'\0') {
        bytes = (long)q - (long)pcVar2;
        __archive_read_consume((archive_read *)p,bytes);
        return L'\0';
      }
    }
    bytes = (long)q - (long)pcVar2;
    __archive_read_consume((archive_read *)p,bytes);
  } while( true );
}

Assistant:

static int
cab_skip_sfx(struct archive_read *a)
{
	const char *p, *q;
	size_t skip;
	ssize_t bytes, window;

	window = 4096;
	for (;;) {
		const char *h = __archive_read_ahead(a, window, &bytes);
		if (h == NULL) {
			/* Remaining size are less than window. */
			window >>= 1;
			if (window < 128) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Couldn't find out CAB header");
				return (ARCHIVE_FATAL);
			}
			continue;
		}
		p = h;
		q = p + bytes;

		/*
		 * Scan ahead until we find something that looks
		 * like the cab header.
		 */
		while (p + 8 < q) {
			int next;
			if ((next = find_cab_magic(p)) == 0) {
				skip = p - h;
				__archive_read_consume(a, skip);
				return (ARCHIVE_OK);
			}
			p += next;
		}
		skip = p - h;
		__archive_read_consume(a, skip);
	}
}